

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBox::coarsen(TagBox *this,IntVect *ratio,Box *cbox)

{
  Box *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  Arena *ar;
  char *__dest;
  char *__src;
  size_t __n;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int ioff;
  ulong uVar20;
  bool bVar21;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  IntVect local_1c4;
  Box *local_1b8;
  BaseFab<char> *local_1b0;
  long local_1a8;
  long local_1a0;
  char *local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  Box *local_140;
  char *local_138;
  long local_130;
  long local_128;
  long local_120;
  char *local_118;
  long local_110;
  ulong local_108;
  long local_100;
  char *local_f8;
  long local_f0;
  long local_e8;
  char *local_e0;
  long local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  Elixir eli;
  Box fdomain;
  TagBox cfab;
  
  local_1f0 = (this->super_BaseFab<char>).dptr;
  iVar2 = (this->super_BaseFab<char>).domain.smallend.vect[0];
  iVar3 = (this->super_BaseFab<char>).domain.smallend.vect[1];
  iVar4 = (this->super_BaseFab<char>).domain.smallend.vect[2];
  iVar5 = (this->super_BaseFab<char>).domain.bigend.vect[0];
  iVar6 = (this->super_BaseFab<char>).domain.bigend.vect[1];
  ar = The_Arena();
  TagBox(&cfab,cbox,1,ar);
  pBVar1 = &(this->super_BaseFab<char>).domain;
  lVar18 = (long)((iVar5 - iVar2) + 1);
  lVar15 = (long)((iVar6 - iVar3) + 1);
  local_1b0 = &this->super_BaseFab<char>;
  BaseFab<char>::elixir<char,_0>(&eli,&cfab.super_BaseFab<char>);
  local_100 = (long)cfab.super_BaseFab<char>.domain.smallend.vect[0];
  local_148 = (long)cfab.super_BaseFab<char>.domain.smallend.vect[1];
  local_150 = (long)((cfab.super_BaseFab<char>.domain.bigend.vect[0] -
                     cfab.super_BaseFab<char>.domain.smallend.vect[0]) + 1);
  local_180 = ((cfab.super_BaseFab<char>.domain.bigend.vect[1] -
               cfab.super_BaseFab<char>.domain.smallend.vect[1]) + 1) * local_150;
  fdomain.smallend.vect._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
  uVar9 = *(undefined8 *)((this->super_BaseFab<char>).domain.smallend.vect + 2);
  fdomain._20_8_ = *(undefined8 *)((this->super_BaseFab<char>).domain.bigend.vect + 2);
  fdomain.bigend.vect[1] =
       (int)((ulong)*(undefined8 *)(this->super_BaseFab<char>).domain.bigend.vect >> 0x20);
  fdomain.smallend.vect[2] = (int)uVar9;
  fdomain.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
  uVar7 = ratio->vect[0];
  local_108 = (ulong)uVar7;
  uVar8 = ratio->vect[1];
  local_158 = (long)(int)uVar8;
  local_c8 = 0;
  uVar16 = 0;
  if (0 < (int)uVar7) {
    uVar16 = (ulong)uVar7;
  }
  local_b8 = 0;
  if (0 < (int)uVar8) {
    local_b8 = (ulong)uVar8;
  }
  uVar8 = ratio->vect[2];
  local_188 = (long)(int)uVar8;
  if (0 < (int)uVar8) {
    local_c8 = (ulong)uVar8;
  }
  lVar17 = (long)(cbox->smallend).vect[2];
  local_190 = (long)(cbox->smallend).vect[1];
  iVar5 = (cbox->smallend).vect[0];
  local_160 = (long)iVar5;
  local_110 = (long)(int)uVar7;
  local_1f0 = local_1f0 +
              (((((lVar17 * local_188 - (long)iVar4) * lVar15 + local_190 * local_158) - (long)iVar3
                ) * lVar18 + local_160 * local_110) - (long)iVar2);
  local_198 = cfab.super_BaseFab<char>.dptr;
  local_1a0 = (long)cfab.super_BaseFab<char>.domain.smallend.vect[2];
  local_168 = (ulong)(uVar7 * iVar5);
  local_d8 = lVar15 * lVar18;
  local_1a8 = local_d8 * local_188;
  local_170 = local_158 * lVar18;
  local_f0 = (long)(cbox->bigend).vect[0];
  local_128 = (long)(cbox->bigend).vect[1];
  local_178 = (long)(cbox->bigend).vect[2];
  local_1b8 = pBVar1;
  local_140 = cbox;
  while (lVar17 <= local_178) {
    local_d0 = lVar17 * local_188;
    local_138 = local_198 + (lVar17 - local_1a0) * local_180;
    local_1e8 = local_1f0;
    lVar15 = local_190;
    local_130 = lVar17;
    while (lVar15 <= local_128) {
      iVar2 = (int)local_158;
      local_f8 = local_138 + (lVar15 - local_148) * local_150;
      lVar17 = local_160;
      uVar19 = local_168;
      local_120 = lVar15;
      local_118 = local_1e8;
      while (lVar17 <= local_f0) {
        bVar21 = false;
        uVar14 = 0;
        local_e8 = lVar17;
        local_e0 = local_1e8;
        while (uVar14 != local_c8) {
          iVar3 = (int)local_d0;
          local_1f8 = local_1e8;
          local_c0 = uVar14;
          for (uVar13 = 0; uVar13 != local_b8; uVar13 = uVar13 + 1) {
            for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
              local_1c4.vect[0] = (int)uVar19 + (int)uVar20;
              local_1c4.vect[1] = (int)uVar13 + (int)lVar15 * iVar2;
              local_1c4.vect[2] = (int)uVar14 + iVar3;
              bVar12 = Box::contains(&fdomain,&local_1c4);
              if (bVar12) {
                bVar12 = bVar21 == false;
                bVar21 = true;
                if (bVar12) {
                  bVar21 = local_1f8[uVar20] != '\0';
                }
              }
            }
            local_1f8 = local_1f8 + lVar18;
          }
          local_1e8 = local_1e8 + local_d8;
          uVar14 = local_c0 + 1;
        }
        local_f8[local_e8 - local_100] = bVar21;
        uVar19 = uVar19 + local_108;
        local_1e8 = local_e0 + local_110;
        lVar17 = local_e8 + 1;
      }
      local_1e8 = local_118 + local_170;
      cbox = local_140;
      lVar15 = local_120 + 1;
    }
    local_1f0 = local_1f0 + local_1a8;
    lVar17 = local_130 + 1;
  }
  __dest = BaseFab<char>::dataPtr(local_1b0,0);
  __src = BaseFab<char>::dataPtr(&cfab.super_BaseFab<char>,0);
  __n = Box::numPts(cbox);
  memcpy(__dest,__src,__n);
  uVar9 = *(undefined8 *)((cbox->smallend).vect + 2);
  uVar10 = *(undefined8 *)(cbox->bigend).vect;
  uVar11 = *(undefined8 *)((cbox->bigend).vect + 2);
  *(undefined8 *)(local_1b8->smallend).vect = *(undefined8 *)(cbox->smallend).vect;
  *(undefined8 *)((local_1b8->smallend).vect + 2) = uVar9;
  *(undefined8 *)(local_1b8->bigend).vect = uVar10;
  *(undefined8 *)((local_1b8->bigend).vect + 2) = uVar11;
  Gpu::Elixir::~Elixir(&eli);
  BaseFab<char>::~BaseFab(&cfab.super_BaseFab<char>);
  return;
}

Assistant:

void
TagBox::coarsen (const IntVect& ratio, const Box& cbox) noexcept
{
    BL_ASSERT(nComp() == 1);
    Array4<char const> const& farr = this->const_array();

    TagBox cfab(cbox, 1, The_Arena());
    Elixir eli = cfab.elixir();
    Array4<char> const& carr = cfab.array();

    Box fdomain = domain;
    Dim3 r{1,1,1};
    AMREX_D_TERM(r.x = ratio[0];, r.y = ratio[1];, r.z = ratio[2]);

    AMREX_HOST_DEVICE_FOR_3D(cbox, i, j, k,
    {
        TagType t = TagBox::CLEAR;
        for (int koff = 0; koff < r.z; ++koff) {
            int kk = k*r.z + koff;
            for (int joff = 0; joff < r.y; ++joff) {
                int jj = j*r.y + joff;
                for (int ioff = 0; ioff < r.x; ++ioff) {
                    int ii = i*r.x + ioff;
                    if (fdomain.contains(IntVect(AMREX_D_DECL(ii,jj,kk)))) {
                        t = t || farr(ii,jj,kk);
                    }
                }
            }
        }
        carr(i,j,k) = t;
    });

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        Gpu::dtod_memcpy_async(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    } else
#endif
    {
        std::memcpy(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    }
    this->domain = cbox;
}